

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O2

bool __thiscall
TreePropagator::reachable
          (TreePropagator *this,int node,vector<bool,_std::allocator<bool>_> *blue,bool doDFS)

{
  bool bVar1;
  Lit LVar2;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  undefined7 in_register_00000009;
  size_type __n;
  Lit *elem;
  BoolView *pBVar3;
  __node_base *p_Var4;
  long lVar5;
  reference rVar6;
  Clause *expl;
  vec<Lit> local_a8;
  long local_98;
  int count;
  uint uStack_8c;
  size_type local_88;
  __node_base local_80;
  size_type sStack_78;
  float local_70;
  size_t local_68;
  __node_base_ptr p_Stack_60;
  vector<bool,_std::allocator<bool>_> pink;
  
  if ((int)CONCAT71(in_register_00000009,doDFS) != 0) {
    pink.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p._0_1_ = 0;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&count,
               (long)(int)(this->super_GraphPropagator).vs.sz,(bool *)&pink,
               (allocator_type *)&local_a8);
    std::vector<bool,_std::allocator<bool>_>::operator=
              (blue,(vector<bool,_std::allocator<bool>_> *)&count);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              ((_Bvector_base<std::allocator<bool>_> *)&count);
    _count = (__node_base_ptr *)((ulong)uStack_8c << 0x20);
    DFSBlue(this,node,blue,&count);
  }
  __n = 0;
  local_98 = (ulong)(uint)node << 4;
  do {
    lVar5 = (long)(int)(this->super_GraphPropagator).vs.sz;
    if (lVar5 <= (long)__n) {
LAB_0015bbfd:
      return lVar5 <= (long)__n;
    }
    rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](blue,__n);
    if ((*rVar6._M_p & rVar6._M_mask) == 0) {
      pBVar3 = (this->super_GraphPropagator).vs.data;
      if (sat.assigns.data[(uint)pBVar3[__n].v] != '\0') {
        bVar1 = BoolView::isTrue(pBVar3 + __n);
        if (bVar1) {
          if (so.lazy == true) {
            _count = &p_Stack_60;
            local_88 = 1;
            local_80._M_nxt = (_Hash_node_base *)0x0;
            sStack_78 = 0;
            local_70 = 1.0;
            local_68 = 0;
            p_Stack_60 = (__node_base_ptr)0x0;
            local_a8._0_8_ = local_a8._0_8_ & 0xffffffffffffff00;
            std::vector<bool,_std::allocator<bool>_>::vector
                      (&pink,(long)(int)(this->super_GraphPropagator).vs.sz,(bool *)&local_a8,
                       (allocator_type *)&expl);
            DFSPink(this,(int)__n,&pink,blue,
                    (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                    &count);
            local_a8.sz = 0;
            local_a8.cap = 0;
            local_a8.data = (Lit *)0x0;
            LVar2 = BoolView::getValLit((BoolView *)
                                        ((long)&(((this->super_GraphPropagator).vs.data)->super_Var)
                                                .super_Branching._vptr_Branching + local_98));
            p_Var4 = &local_80;
            expl = (Clause *)CONCAT44(expl._4_4_,LVar2.x);
            while( true ) {
              vec<Lit>::push(&local_a8,(Lit *)&expl);
              p_Var4 = p_Var4->_M_nxt;
              if (p_Var4 == (_Hash_node_base *)0x0) break;
              LVar2 = BoolView::getValLit((this->super_GraphPropagator).es.data +
                                          *(uint *)&p_Var4[1]._M_nxt);
              expl = (Clause *)CONCAT44(expl._4_4_,LVar2.x);
            }
            LVar2 = BoolView::getValLit((this->super_GraphPropagator).vs.data + __n);
            elem = (Lit *)&expl;
            expl = (Clause *)CONCAT44(expl._4_4_,LVar2.x);
            vec<Lit>::push(&local_a8,elem);
            expl = Clause_new<vec<Lit>>(&local_a8,SUB81(elem,0));
            *(byte *)expl = *(byte *)expl | 2;
            vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&expl);
            sat.confl = expl;
            free(local_a8.data);
            std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                      (&pink.super__Bvector_base<std::allocator<bool>_>);
            std::
            _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)&count);
          }
          goto LAB_0015bbfd;
        }
      }
    }
    rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](blue,__n);
    if ((*rVar6._M_p & rVar6._M_mask) == 0) {
      pBVar3 = (this->super_GraphPropagator).vs.data;
      if (sat.assigns.data[(uint)pBVar3[__n].v] == '\0') {
        if (so.lazy == true) {
          _count = &p_Stack_60;
          local_88 = 1;
          local_80._M_nxt = (_Hash_node_base *)0x0;
          sStack_78 = 0;
          local_70 = 1.0;
          local_68 = 0;
          p_Stack_60 = (__node_base_ptr)0x0;
          local_a8._0_8_ = local_a8._0_8_ & 0xffffffffffffff00;
          std::vector<bool,_std::allocator<bool>_>::vector
                    ((vector<bool,_std::allocator<bool>_> *)
                     &pink.super__Bvector_base<std::allocator<bool>_>,
                     (long)(int)(this->super_GraphPropagator).vs.sz,(bool *)&local_a8,
                     (allocator_type *)&expl);
          DFSPink(this,(int)__n,
                  (vector<bool,_std::allocator<bool>_> *)
                  &pink.super__Bvector_base<std::allocator<bool>_>,blue,
                  (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                  &count);
          local_a8.sz = 0;
          local_a8.cap = 0;
          local_a8.data = (Lit *)0x0;
          vec<Lit>::push(&local_a8);
          LVar2 = BoolView::getValLit((BoolView *)
                                      ((long)&(((this->super_GraphPropagator).vs.data)->super_Var).
                                              super_Branching._vptr_Branching + local_98));
          expl = (Clause *)CONCAT44(expl._4_4_,LVar2.x);
          vec<Lit>::push(&local_a8,(Lit *)&expl);
          p_Var4 = &local_80;
          while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
            LVar2 = BoolView::getValLit((this->super_GraphPropagator).es.data +
                                        *(uint *)&p_Var4[1]._M_nxt);
            expl = (Clause *)CONCAT44(expl._4_4_,LVar2.x);
            vec<Lit>::push(&local_a8,(Lit *)&expl);
          }
          r._pt = Reason_new<vec<Lit>>(&local_a8);
          free(local_a8.data);
          std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                    (&pink.super__Bvector_base<std::allocator<bool>_>);
          std::
          _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)&count);
          pBVar3 = (this->super_GraphPropagator).vs.data;
        }
        else {
          r._pt = (Clause *)0x0;
        }
        BoolView::setVal2(pBVar3 + __n,false,(Reason)r);
        Tint::operator=((this->last_state_n).super__Vector_base<Tint,_std::allocator<Tint>_>._M_impl
                        .super__Vector_impl_data._M_start + __n,1);
      }
    }
    __n = __n + 1;
  } while( true );
}

Assistant:

bool TreePropagator::reachable(int node, std::vector<bool>& blue, bool doDFS) {
	if (doDFS) {
		blue = std::vector<bool>(nbNodes(), false);
		int count = 0;
		DFSBlue(node, blue, count);
	}
	for (int i = 0; i < nbNodes(); i++) {
		if (blue[i] == false && getNodeVar(i).isFixed() && getNodeVar(i).isTrue()) {
			if (so.lazy) {
				std::unordered_set<edge_id> badEdges;
				std::vector<bool> pink(nbNodes(), false);
				DFSPink(i, pink, blue, badEdges);
				// REASON: 0<i<n visited[i] /\ any-fixed-not-visited => fail

				vec<Lit> ps;
				assert(getNodeVar(node).isFixed());
				ps.push(getNodeVar(node).getValLit());
				std::unordered_set<edge_id>::iterator it;
				for (it = badEdges.begin(); it != badEdges.end(); ++it) {
					assert(getEdgeVar(*it).isFixed());
					ps.push(getEdgeVar(*it).getValLit());
				}
				assert(getNodeVar(i).isFixed());
				ps.push(getNodeVar(i).getValLit());
				Clause* expl = Clause_new(ps);
				expl->temp_expl = 1;
				sat.rtrail.last().push(expl);
				sat.confl = expl;
			}
			return false;
		}
		if (blue[i] == false && !getNodeVar(i).isFixed()) {
			Clause* r = nullptr;
			if (so.lazy) {
				std::unordered_set<edge_id> badEdges;
				std::vector<bool> pink(nbNodes(), false);
				DFSPink(i, pink, blue, badEdges);
				// REASON: 0<i<n visited[i] => unfixed-not-visited = false

				vec<Lit> ps;
				ps.push();
				assert(getNodeVar(node).isFixed());
				ps.push(getNodeVar(node).getValLit());
				std::unordered_set<edge_id>::iterator it;
				for (it = badEdges.begin(); it != badEdges.end(); ++it) {
					assert(getEdgeVar(*it).isFixed());
					ps.push(getEdgeVar(*it).getValLit());
				}
				r = Reason_new(ps);
			}
			// cout << "REACHABLE (N) "<<i<<endl;
			getNodeVar(i).setVal2(false, r);
			last_state_n[i] = VT_OUT;
		}
	}
	return true;
}